

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectBuilder.cpp
# Opt level: O3

ObjectBuilder * __thiscall
ObjectBuilder::putAttribute
          (ObjectBuilder *this,Identifier *ident,bool constant,ptr<Value> *value,Scope scope)

{
  ptr<Value> local_18;
  
  local_18.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  Environment::putValue(&this->members,ident,scope,&local_18,constant);
  if (local_18.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return this;
}

Assistant:

ObjectBuilder &ObjectBuilder::putAttribute(const Identifier &ident, bool constant, ptr<Value> value, Scope scope) {
    members.putValue(ident, scope, std::move(value), constant);
    return *this;
}